

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_reader.cpp
# Opt level: O2

void __thiscall
HttpdBufferedReader_GetTwoStringsLFThenEOF_Test::~HttpdBufferedReader_GetTwoStringsLFThenEOF_Test
          (HttpdBufferedReader_GetTwoStringsLFThenEOF_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (HttpdBufferedReader, GetTwoStringsLFThenEOF) {
    refiller r;
    EXPECT_CALL (r, fill (_, _)).WillRepeatedly (Invoke (eof ()));
    EXPECT_CALL (r, fill (0, _)).WillOnce (Invoke (yield_string ("abc\ndef")));

    auto io = 0;
    auto br = make_buffered_reader<int> (r.refill_function ());
    {
        gets_result_type const s1 = br.gets (io);
        ASSERT_TRUE (static_cast<bool> (s1));
        maybe<std::string> str1;
        std::tie (io, str1) = *s1;
        ASSERT_TRUE (str1.has_value ());
        EXPECT_EQ (str1.value (), "abc");
    }
    {
        gets_result_type const s2 = br.gets (io);
        ASSERT_TRUE (static_cast<bool> (s2));
        maybe<std::string> str2;
        std::tie (io, str2) = *s2;
        ASSERT_TRUE (str2.has_value ());
        EXPECT_EQ (str2.value (), "def");
    }
    {
        gets_result_type const s3 = br.gets (io);
        ASSERT_TRUE (static_cast<bool> (s3));
        maybe<std::string> str3;
        std::tie (io, str3) = *s3;
        ASSERT_FALSE (str3.has_value ());
    }
}